

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsMotor::ChShaftsMotor(ChShaftsMotor *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = auVar1;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.system =
       (ChSystem *)auVar1._0_8_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1 = auVar1;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotor_00b4ac68;
  this->motor_set_rot_dt = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  auVar2 = ZEXT464(0) << 0x40;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar2._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar2._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar2._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar2._48_16_;
  this->motor_mode = MOT_MODE_TORQUE;
  return;
}

Assistant:

ChShaftsMotor::ChShaftsMotor() : motor_torque(0), motor_set_rot(0), motor_set_rot_dt(0), motor_mode(MOT_MODE_TORQUE) {}